

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_D3D_srcarg_string_in_buf(Context *ctx,SourceArgInfo *arg,char *buf,size_t buflen)

{
  int iVar1;
  char *pcVar2;
  ulong uStack_c0;
  int scalar;
  size_t i;
  char *pcStack_b0;
  char swizzle_str [6];
  char *rel_regtype_str;
  char rel_regnum_str [16];
  char *pcStack_90;
  char rel_swizzle [4];
  char *rel_rbracket;
  char *rel_lbracket;
  char *regtype_str;
  char regnum_str [16];
  char *local_60;
  char *postmod_str;
  char *premod_str;
  size_t buflen_local;
  char *buf_local;
  SourceArgInfo *arg_local;
  Context *ctx_local;
  
  postmod_str = "";
  local_60 = "";
  switch(arg->src_mod) {
  case SRCMOD_NONE:
  case SRCMOD_TOTAL:
    break;
  case SRCMOD_NEGATE:
    postmod_str = "-";
    break;
  case SRCMOD_BIASNEGATE:
    postmod_str = "-";
  case SRCMOD_BIAS:
    local_60 = "_bias";
    break;
  case SRCMOD_SIGNNEGATE:
    postmod_str = "-";
  case SRCMOD_SIGN:
    local_60 = "_bx2";
    break;
  case SRCMOD_COMPLEMENT:
    postmod_str = "1-";
    break;
  case SRCMOD_X2NEGATE:
    postmod_str = "-";
  case SRCMOD_X2:
    local_60 = "_x2";
    break;
  case SRCMOD_DZ:
    local_60 = "_dz";
    break;
  case SRCMOD_DW:
    local_60 = "_dw";
    break;
  case SRCMOD_ABSNEGATE:
    postmod_str = "-";
  case SRCMOD_ABS:
    local_60 = "_abs";
    break;
  case SRCMOD_NOT:
    postmod_str = "!";
  }
  pcVar2 = get_D3D_register_string(ctx,arg->regtype,arg->regnum,(char *)&regtype_str,0x10);
  if (pcVar2 == (char *)0x0) {
    fail(ctx,"Unknown source register type.");
    *buf = '\0';
  }
  else {
    rel_rbracket = "";
    pcStack_90 = "";
    memset(rel_regnum_str + 0xc,0,4);
    memset(&rel_regtype_str,0,0x10);
    pcStack_b0 = "";
    if (arg->relative != 0) {
      rel_regnum_str[0xc] = '.';
      rel_regnum_str[0xd] = "xyzw"[arg->relative_component];
      rel_regnum_str[0xe] = '\0';
      rel_rbracket = "[";
      pcStack_90 = "]";
      pcStack_b0 = get_D3D_register_string
                             (ctx,arg->relative_regtype,arg->relative_regnum,
                              (char *)&rel_regtype_str,0x10);
      if (pcVar2 == (char *)0x0) {
        fail(ctx,"Unknown relative source register type.");
        *buf = '\0';
        return buf;
      }
    }
    uStack_c0 = 0;
    iVar1 = isscalar(ctx,ctx->shader_type,arg->regtype,arg->regnum);
    if ((iVar1 == 0) && (iVar1 = no_swizzle(arg->swizzle), iVar1 == 0)) {
      i._2_1_ = 0x2e;
      i._3_1_ = "xyzw"[arg->swizzle_x];
      i._4_1_ = "xyzw"[arg->swizzle_y];
      i._5_1_ = "xyzw"[arg->swizzle_z];
      i._6_1_ = "xyzw"[arg->swizzle_w];
      for (uStack_c0 = 5; *(char *)((long)&i + uStack_c0 + 1) == *(char *)((long)&i + uStack_c0);
          uStack_c0 = uStack_c0 - 1) {
      }
    }
    *(undefined1 *)((long)&i + uStack_c0 + 2) = 0;
    if (5 < uStack_c0) {
      __assert_fail("i < sizeof (swizzle_str)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x403,
                    "const char *make_D3D_srcarg_string_in_buf(Context *, const SourceArgInfo *, char *, size_t)"
                   );
    }
    snprintf(buf,buflen,"%s%s%s%s%s%s%s%s%s%s",postmod_str,pcVar2,&regtype_str,local_60,rel_rbracket
             ,pcStack_b0,&rel_regtype_str,rel_regnum_str + 0xc,pcStack_90,(long)&i + 2);
  }
  return buf;
}

Assistant:

static const char *make_D3D_srcarg_string_in_buf(Context *ctx,
                                                 const SourceArgInfo *arg,
                                                 char *buf, size_t buflen)
{
    const char *premod_str = "";
    const char *postmod_str = "";
    switch (arg->src_mod)
    {
        case SRCMOD_NEGATE:
            premod_str = "-";
            break;

        case SRCMOD_BIASNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_BIAS:
            postmod_str = "_bias";
            break;

        case SRCMOD_SIGNNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_SIGN:
            postmod_str = "_bx2";
            break;

        case SRCMOD_COMPLEMENT:
            premod_str = "1-";
            break;

        case SRCMOD_X2NEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_X2:
            postmod_str = "_x2";
            break;

        case SRCMOD_DZ:
            postmod_str = "_dz";
            break;

        case SRCMOD_DW:
            postmod_str = "_dw";
            break;

        case SRCMOD_ABSNEGATE:
            premod_str = "-";
            // fall through.
        case SRCMOD_ABS:
            postmod_str = "_abs";
            break;

        case SRCMOD_NOT:
            premod_str = "!";
            break;

        case SRCMOD_NONE:
        case SRCMOD_TOTAL:
             break;  // stop compiler whining.
    } // switch


    char regnum_str[16];
    const char *regtype_str = get_D3D_register_string(ctx, arg->regtype,
                                                      arg->regnum, regnum_str,
                                                      sizeof (regnum_str));

    if (regtype_str == NULL)
    {
        fail(ctx, "Unknown source register type.");
        *buf = '\0';
        return buf;
    } // if

    const char *rel_lbracket = "";
    const char *rel_rbracket = "";
    char rel_swizzle[4] = { '\0' };
    char rel_regnum_str[16] = { '\0' };
    const char *rel_regtype_str = "";
    if (arg->relative)
    {
        rel_swizzle[0] = '.';
        rel_swizzle[1] = swizzle_channels[arg->relative_component];
        rel_swizzle[2] = '\0';
        rel_lbracket = "[";
        rel_rbracket = "]";
        rel_regtype_str = get_D3D_register_string(ctx, arg->relative_regtype,
                                                  arg->relative_regnum,
                                                  rel_regnum_str,
                                                  sizeof (rel_regnum_str));

        if (regtype_str == NULL)
        {
            fail(ctx, "Unknown relative source register type.");
            *buf = '\0';
            return buf;
        } // if
    } // if

    char swizzle_str[6];
    size_t i = 0;
    const int scalar = isscalar(ctx, ctx->shader_type, arg->regtype, arg->regnum);
    if (!scalar && !no_swizzle(arg->swizzle))
    {
        swizzle_str[i++] = '.';
        swizzle_str[i++] = swizzle_channels[arg->swizzle_x];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_y];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_z];
        swizzle_str[i++] = swizzle_channels[arg->swizzle_w];

        // .xyzz is the same as .xyz, .z is the same as .zzzz, etc.
        while (swizzle_str[i-1] == swizzle_str[i-2])
            i--;
    } // if
    swizzle_str[i] = '\0';
    assert(i < sizeof (swizzle_str));

    // !!! FIXME: c12[a0.x] actually needs to be c[a0.x + 12]
    snprintf(buf, buflen, "%s%s%s%s%s%s%s%s%s%s",
             premod_str, regtype_str, regnum_str, postmod_str,
             rel_lbracket, rel_regtype_str, rel_regnum_str, rel_swizzle,
             rel_rbracket, swizzle_str);
    // !!! FIXME: make sure the scratch buffer was large enough.
    return buf;
}